

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.h
# Opt level: O1

int __thiscall
cppqc::StatelessGenerator<std::vector<int,_std::allocator<int>_>_>::
StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_>::clone
          (StatelessGenModel<cppqc::detail::ListOfStatelessGenerator<int>_> *this,__fn *__fn,
          void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  long *plVar2;
  undefined8 uVar3;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  plVar2 = (long *)(**(code **)(*(long *)(this->m_obj).m_gen.m_gen._M_t.
                                         super___uniq_ptr_impl<cppqc::detail::StatelessGenConcept<int>,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_std::default_delete<cppqc::detail::StatelessGenConcept<int>_>_>
                                         .
                                         super__Head_base<0UL,_cppqc::detail::StatelessGenConcept<int>_*,_false>
                               + 0x20))();
  *puVar1 = &PTR__StatelessGenModel_0022a458;
  uVar3 = (**(code **)(*plVar2 + 0x20))(plVar2);
  puVar1[1] = uVar3;
  (**(code **)(*plVar2 + 8))(plVar2);
  return (int)puVar1;
}

Assistant:

detail::StatelessGenConcept<T>* clone() const override {
      return new StatelessGenModel(m_obj);
    }